

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O1

int Amap_LibCreateNode(Amap_Lib_t *p,int iFan0,int iFan1,int fXor)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  bool bVar5;
  Amap_Nod_t *pAVar6;
  void *pvVar7;
  long lVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int *piVar16;
  
  uVar15 = (ulong)(uint)iFan1;
  if (iFan0 < iFan1) {
    uVar15 = (ulong)(uint)iFan0;
  }
  uVar12 = (ulong)(uint)iFan1;
  if (iFan1 < iFan0) {
    uVar12 = (ulong)(uint)iFan0;
  }
  pAVar6 = Amap_LibCreateObj(p);
  uVar13 = *(uint *)pAVar6;
  uVar9 = (uVar13 & 0xffffff) + (uint)(fXor != 0) * 0x1000000 + 0x4000000;
  *(uint *)pAVar6 = uVar9;
  uVar11 = (uint)uVar12;
  if (((int)uVar11 < 0) || (uVar14 = (uint)uVar15, (int)uVar14 < 0)) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  *(uint *)pAVar6 =
       uVar9 & 0x500ffff |
       (uint)(byte)p->pNodes[uVar12 >> 1].field_0x2 * 0x10000 + *(int *)(p->pNodes + (uVar15 >> 1))
       & 0xff0000;
  pAVar6->iFan0 = (short)uVar12;
  pAVar6->iFan1 = (short)uVar15;
  if (p->fVerbose != 0) {
    uVar10 = 0x78;
    if (fXor == 0) {
      uVar10 = 0x20;
    }
    printf("Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c\n",(ulong)(uVar13 & 0xffff),uVar10,
           uVar12 >> 1,(ulong)((uVar11 & 1) * 2 + 0x2b),uVar15 >> 1,(uVar14 & 1) * 2 + 0x2b);
  }
  if (fXor == 0) {
    pVVar3 = p->vRules;
    if (iFan1 == iFan0) {
      if (pVVar3->nSize <= (int)uVar11) goto LAB_0041e556;
      piVar16 = (int *)pVVar3->pArray[uVar12];
      iVar1 = *(int *)pAVar6;
      iVar2 = *piVar16;
      if ((piVar16[1] == iVar2) && (iVar2 < iVar2 * 2)) {
        if (*(void **)(piVar16 + 2) == (void *)0x0) {
          pvVar7 = malloc((long)iVar2 << 3);
        }
        else {
          pvVar7 = realloc(*(void **)(piVar16 + 2),(long)iVar2 << 3);
        }
        *(void **)(piVar16 + 2) = pvVar7;
        if (pvVar7 == (void *)0x0) goto LAB_0041e575;
        *piVar16 = iVar2 * 2;
      }
      uVar13 = iVar1 << 0x10 | uVar14;
      lVar8 = (long)piVar16[1];
      piVar16[1] = piVar16[1] + 1;
      if (lVar8 < 1) goto LAB_0041e51b;
      lVar4 = *(long *)(piVar16 + 2);
      do {
        uVar9 = *(uint *)(lVar4 + -4 + lVar8 * 4);
        if ((uVar9 & 0xffff) <= (uVar14 & 0xffff)) goto LAB_0041e51b;
        *(uint *)(lVar4 + lVar8 * 4) = uVar9;
        bVar5 = 1 < lVar8;
        lVar8 = lVar8 + -1;
      } while (bVar5);
    }
    else {
      if (pVVar3->nSize <= (int)uVar11) goto LAB_0041e556;
      piVar16 = (int *)pVVar3->pArray[uVar12];
      iVar1 = *(int *)pAVar6;
      iVar2 = *piVar16;
      if ((piVar16[1] == iVar2) && (iVar2 < iVar2 * 2)) {
        if (*(void **)(piVar16 + 2) == (void *)0x0) {
          pvVar7 = malloc((long)iVar2 << 3);
        }
        else {
          pvVar7 = realloc(*(void **)(piVar16 + 2),(long)iVar2 << 3);
        }
        *(void **)(piVar16 + 2) = pvVar7;
        if (pvVar7 == (void *)0x0) goto LAB_0041e575;
        *piVar16 = iVar2 * 2;
      }
      lVar8 = (long)piVar16[1];
      piVar16[1] = piVar16[1] + 1;
      if (0 < lVar8) {
        lVar4 = *(long *)(piVar16 + 2);
        do {
          uVar13 = *(uint *)(lVar4 + -4 + lVar8 * 4);
          if ((uVar13 & 0xffff) <= (uVar14 & 0xffff)) goto LAB_0041e474;
          *(uint *)(lVar4 + lVar8 * 4) = uVar13;
          bVar5 = 1 < lVar8;
          lVar8 = lVar8 + -1;
        } while (bVar5);
        lVar8 = 0;
      }
LAB_0041e474:
      *(uint *)(*(long *)(piVar16 + 2) + (long)(int)lVar8 * 4) = iVar1 << 0x10 | uVar14;
      if (p->vRules->nSize <= (int)uVar14) goto LAB_0041e556;
      piVar16 = (int *)p->vRules->pArray[uVar15];
      iVar1 = *(int *)pAVar6;
      iVar2 = *piVar16;
      if ((piVar16[1] == iVar2) && (iVar2 < iVar2 * 2)) {
        if (*(void **)(piVar16 + 2) == (void *)0x0) {
          pvVar7 = malloc((long)iVar2 << 3);
        }
        else {
          pvVar7 = realloc(*(void **)(piVar16 + 2),(long)iVar2 << 3);
        }
        *(void **)(piVar16 + 2) = pvVar7;
        if (pvVar7 == (void *)0x0) goto LAB_0041e575;
        *piVar16 = iVar2 * 2;
      }
      uVar13 = iVar1 << 0x10 | uVar11;
      lVar8 = (long)piVar16[1];
      piVar16[1] = piVar16[1] + 1;
      if (lVar8 < 1) goto LAB_0041e51b;
      lVar4 = *(long *)(piVar16 + 2);
      do {
        uVar9 = *(uint *)(lVar4 + -4 + lVar8 * 4);
        if ((uVar9 & 0xffff) <= (uVar11 & 0xffff)) goto LAB_0041e51b;
        *(uint *)(lVar4 + lVar8 * 4) = uVar9;
        bVar5 = 1 < lVar8;
        lVar8 = lVar8 + -1;
      } while (bVar5);
    }
  }
  else {
    pVVar3 = p->vRulesX;
    if (iFan1 == iFan0) {
      if (pVVar3->nSize <= (int)uVar11) goto LAB_0041e556;
      piVar16 = (int *)pVVar3->pArray[uVar12];
      iVar1 = *(int *)pAVar6;
      iVar2 = *piVar16;
      if ((piVar16[1] == iVar2) && (iVar2 < iVar2 * 2)) {
        if (*(void **)(piVar16 + 2) == (void *)0x0) {
          pvVar7 = malloc((long)iVar2 << 3);
        }
        else {
          pvVar7 = realloc(*(void **)(piVar16 + 2),(long)iVar2 << 3);
        }
        *(void **)(piVar16 + 2) = pvVar7;
        if (pvVar7 == (void *)0x0) {
LAB_0041e575:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *piVar16 = iVar2 * 2;
      }
      uVar13 = iVar1 << 0x10 | uVar14;
      lVar8 = (long)piVar16[1];
      piVar16[1] = piVar16[1] + 1;
      if (lVar8 < 1) goto LAB_0041e51b;
      lVar4 = *(long *)(piVar16 + 2);
      do {
        uVar9 = *(uint *)(lVar4 + -4 + lVar8 * 4);
        if ((uVar9 & 0xffff) <= (uVar14 & 0xffff)) goto LAB_0041e51b;
        *(uint *)(lVar4 + lVar8 * 4) = uVar9;
        bVar5 = 1 < lVar8;
        lVar8 = lVar8 + -1;
      } while (bVar5);
    }
    else {
      if (pVVar3->nSize <= (int)uVar11) {
LAB_0041e556:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar16 = (int *)pVVar3->pArray[uVar12];
      iVar1 = *(int *)pAVar6;
      iVar2 = *piVar16;
      if ((piVar16[1] == iVar2) && (iVar2 < iVar2 * 2)) {
        if (*(void **)(piVar16 + 2) == (void *)0x0) {
          pvVar7 = malloc((long)iVar2 << 3);
        }
        else {
          pvVar7 = realloc(*(void **)(piVar16 + 2),(long)iVar2 << 3);
        }
        *(void **)(piVar16 + 2) = pvVar7;
        if (pvVar7 == (void *)0x0) goto LAB_0041e575;
        *piVar16 = iVar2 * 2;
      }
      lVar8 = (long)piVar16[1];
      piVar16[1] = piVar16[1] + 1;
      if (0 < lVar8) {
        lVar4 = *(long *)(piVar16 + 2);
        do {
          uVar13 = *(uint *)(lVar4 + -4 + lVar8 * 4);
          if ((uVar13 & 0xffff) <= (uVar14 & 0xffff)) goto LAB_0041e309;
          *(uint *)(lVar4 + lVar8 * 4) = uVar13;
          bVar5 = 1 < lVar8;
          lVar8 = lVar8 + -1;
        } while (bVar5);
        lVar8 = 0;
      }
LAB_0041e309:
      *(uint *)(*(long *)(piVar16 + 2) + (long)(int)lVar8 * 4) = iVar1 << 0x10 | uVar14;
      if (p->vRulesX->nSize <= (int)uVar14) goto LAB_0041e556;
      piVar16 = (int *)p->vRulesX->pArray[uVar15];
      iVar1 = *(int *)pAVar6;
      iVar2 = *piVar16;
      if ((piVar16[1] == iVar2) && (iVar2 < iVar2 * 2)) {
        if (*(void **)(piVar16 + 2) == (void *)0x0) {
          pvVar7 = malloc((long)iVar2 << 3);
        }
        else {
          pvVar7 = realloc(*(void **)(piVar16 + 2),(long)iVar2 << 3);
        }
        *(void **)(piVar16 + 2) = pvVar7;
        if (pvVar7 == (void *)0x0) goto LAB_0041e575;
        *piVar16 = iVar2 * 2;
      }
      uVar13 = iVar1 << 0x10 | uVar11;
      lVar8 = (long)piVar16[1];
      piVar16[1] = piVar16[1] + 1;
      if (lVar8 < 1) goto LAB_0041e51b;
      lVar4 = *(long *)(piVar16 + 2);
      do {
        uVar9 = *(uint *)(lVar4 + -4 + lVar8 * 4);
        if ((uVar9 & 0xffff) <= (uVar11 & 0xffff)) goto LAB_0041e51b;
        *(uint *)(lVar4 + lVar8 * 4) = uVar9;
        bVar5 = 1 < lVar8;
        lVar8 = lVar8 + -1;
      } while (bVar5);
    }
  }
  lVar8 = 0;
LAB_0041e51b:
  *(uint *)(*(long *)(piVar16 + 2) + (long)(int)lVar8 * 4) = uVar13;
  return (int)*(ushort *)pAVar6;
}

Assistant:

int Amap_LibCreateNode( Amap_Lib_t * p, int iFan0, int iFan1, int fXor )
{
    Amap_Nod_t * pNode;
    int iFan;
    if ( iFan0 < iFan1 )
    {
        iFan  = iFan0;
        iFan0 = iFan1;
        iFan1 = iFan;
    }
    pNode = Amap_LibCreateObj( p );
    pNode->Type  = fXor? AMAP_OBJ_XOR : AMAP_OBJ_AND;
    pNode->nSuppSize = p->pNodes[Abc_Lit2Var(iFan0)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan1)].nSuppSize;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
if ( p->fVerbose )
printf( "Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c\n", 
pNode->Id, (fXor?'x':' '), 
Abc_Lit2Var(iFan0), (Abc_LitIsCompl(iFan0)?'-':'+'), 
Abc_Lit2Var(iFan1), (Abc_LitIsCompl(iFan1)?'-':'+') );

    if ( fXor )
    {
        if ( iFan0 == iFan1 )
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan0), (pNode->Id << 16) | iFan1 );
        else
        {
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan0), (pNode->Id << 16) | iFan1 );
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan1), (pNode->Id << 16) | iFan0 );
        }
    }
    else
    {
        if ( iFan0 == iFan1 )
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan0), (pNode->Id << 16) | iFan1 );
        else
        {
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan0), (pNode->Id << 16) | iFan1 );
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan1), (pNode->Id << 16) | iFan0 );
        }
    }
    return pNode->Id;
}